

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

shared_ptr<Pipeline> __thiscall
anon_unknown.dwarf_2a363f::ImageOptimizer::makePipeline
          (ImageOptimizer *this,string *description,Pipeline *next)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  longlong lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Any_data *this_00;
  double dVar7;
  shared_ptr<Pipeline> sVar8;
  J_COLOR_SPACE local_148;
  J_COLOR_SPACE local_144;
  string colorspace;
  QPDFObjectHandle h_obj;
  uint local_110;
  uint local_10c;
  QPDFObjectHandle w_obj;
  QPDFObjectHandle dict;
  QPDFObjectHandle components_obj;
  QPDFObjectHandle colorspace_obj;
  __shared_ptr<Pl_DCT,_(__gnu_cxx::_Lock_policy)2> local_c8;
  Pipeline *next_local;
  size_type local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  (this->super_StreamDataProvider)._vptr_StreamDataProvider = (_func_int **)0x0;
  *(undefined8 *)&(this->super_StreamDataProvider).supports_retry = 0;
  QPDFObjectHandle::getDict(&dict);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorspace,"/Width",(allocator<char> *)&h_obj);
  QPDFObjectHandle::getKey(&w_obj,(string *)&dict);
  std::__cxx11::string::~string((string *)&colorspace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorspace,"/Height",(allocator<char> *)&colorspace_obj);
  QPDFObjectHandle::getKey(&h_obj,(string *)&dict);
  std::__cxx11::string::~string((string *)&colorspace);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorspace,"/ColorSpace",(allocator<char> *)&components_obj);
  QPDFObjectHandle::getKey(&colorspace_obj,(string *)&dict);
  std::__cxx11::string::~string((string *)&colorspace);
  bVar3 = QPDFObjectHandle::isNumber(&w_obj);
  if ((!bVar3) || (bVar3 = QPDFObjectHandle::isNumber(&h_obj), !bVar3)) {
    if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
      local_48._8_8_ = 0;
      local_30 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
                 ::_M_manager;
      local_48._M_unused._M_object = next;
      QPDFJob::doIfVerbose
                ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                 (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_48);
      std::_Function_base::~_Function_base((_Function_base *)&local_48);
    }
    goto LAB_0016e000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorspace,"/BitsPerComponent",(allocator<char> *)&local_c8);
  QPDFObjectHandle::getKey(&components_obj,(string *)&dict);
  std::__cxx11::string::~string((string *)&colorspace);
  bVar3 = QPDFObjectHandle::isInteger(&components_obj);
  if ((bVar3) && (lVar6 = QPDFObjectHandle::getIntValue(&components_obj), lVar6 == 8)) {
    bVar3 = QPDFObjectHandle::isInteger(&w_obj);
    if (bVar3) {
      uVar4 = QPDFObjectHandle::getUIntValueAsUInt(&w_obj);
    }
    else {
      dVar7 = QPDFObjectHandle::getNumericValue(&w_obj);
      uVar4 = (uint)(long)dVar7;
    }
    local_10c = uVar4;
    bVar3 = QPDFObjectHandle::isInteger(&h_obj);
    if (bVar3) {
      uVar5 = QPDFObjectHandle::getUIntValueAsUInt(&h_obj);
    }
    else {
      dVar7 = QPDFObjectHandle::getNumericValue(&h_obj);
      uVar5 = (uint)(long)dVar7;
    }
    local_110 = uVar5;
    bVar3 = QPDFObjectHandle::isName(&colorspace_obj);
    if (bVar3) {
      QPDFObjectHandle::getName_abi_cxx11_(&colorspace,&colorspace_obj);
    }
    else {
      colorspace._M_dataplus._M_p = (pointer)&colorspace.field_2;
      colorspace._M_string_length = 0;
      colorspace.field_2._M_local_buf[0] = '\0';
    }
    bVar3 = std::operator==(&colorspace,"/DeviceRGB");
    if (bVar3) {
      local_144 = JCS_YCbCr;
      local_148 = JCS_RGB;
LAB_0016df6d:
      uVar1 = *(ulong *)((long)&description->field_2 + 8);
      if ((((uVar1 == 0) || (uVar1 < uVar4)) &&
          ((pcVar2 = description[1]._M_dataplus._M_p, pcVar2 == (pointer)0x0 ||
           (pcVar2 < (pointer)(ulong)uVar5)))) &&
         ((description[1]._M_string_length == 0 ||
          (description[1]._M_string_length < (ulong)(uVar5 * uVar4))))) {
        local_b0 = description[2]._M_string_length;
        std::
        make_shared<Pl_DCT,char_const(&)[4],Pipeline*&,unsigned_int&,unsigned_int&,int&,J_COLOR_SPACE&,Pl_DCT::CompressConfig*>
                  ((char (*) [4])&local_c8,(Pipeline **)"jpg",(uint *)&next_local,&local_10c,
                   (int *)&local_110,&local_144,(CompressConfig **)&local_148);
        std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)this,&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      }
      else if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
        local_a8._8_8_ = 0;
        local_90 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                   ::_M_invoke;
        local_98 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                   ::_M_manager;
        local_a8._M_unused._M_object = next;
        QPDFJob::doIfVerbose
                  ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                   (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_a8);
        this_00 = &local_a8;
LAB_0016dfe7:
        std::_Function_base::~_Function_base((_Function_base *)this_00);
      }
    }
    else {
      bVar3 = std::operator==(&colorspace,"/DeviceGray");
      if (bVar3) {
        local_148 = JCS_GRAYSCALE;
        local_144 = local_148;
        goto LAB_0016df6d;
      }
      bVar3 = std::operator==(&colorspace,"/DeviceCMYK");
      if (bVar3) {
        local_148 = JCS_CMYK;
        local_144 = local_148;
        goto LAB_0016df6d;
      }
      if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
        local_88._8_8_ = 0;
        local_70 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                   ::_M_manager;
        local_88._M_unused._M_object = next;
        QPDFJob::doIfVerbose
                  ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                   (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_88);
        this_00 = &local_88;
        goto LAB_0016dfe7;
      }
    }
    std::__cxx11::string::~string((string *)&colorspace);
  }
  else if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
               ::_M_manager;
    local_68._M_unused._M_object = next;
    QPDFJob::doIfVerbose
              ((QPDFJob *)(description->field_2)._M_allocated_capacity,
               (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&components_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0016e000:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&colorspace_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&h_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&w_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar8.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar8.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
ImageOptimizer::makePipeline(std::string const& description, Pipeline* next)
{
    std::shared_ptr<Pipeline> result;
    QPDFObjectHandle dict = image.getDict();
    QPDFObjectHandle w_obj = dict.getKey("/Width");
    QPDFObjectHandle h_obj = dict.getKey("/Height");
    QPDFObjectHandle colorspace_obj = dict.getKey("/ColorSpace");
    if (!(w_obj.isNumber() && h_obj.isNumber())) {
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image dictionary is missing required keys\n";
            });
        }
        return result;
    }
    QPDFObjectHandle components_obj = dict.getKey("/BitsPerComponent");
    if (!(components_obj.isInteger() && (components_obj.getIntValue() == 8))) {
        QTC::TC("qpdf", "QPDFJob image optimize bits per component");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image has other than 8 bits per component\n";
            });
        }
        return result;
    }
    // Files have been seen in the wild whose width and height are floating point, which is goofy,
    // but we can deal with it.
    JDIMENSION w = 0;
    if (w_obj.isInteger()) {
        w = w_obj.getUIntValueAsUInt();
    } else {
        w = static_cast<JDIMENSION>(w_obj.getNumericValue());
    }
    JDIMENSION h = 0;
    if (h_obj.isInteger()) {
        h = h_obj.getUIntValueAsUInt();
    } else {
        h = static_cast<JDIMENSION>(h_obj.getNumericValue());
    }
    std::string colorspace = (colorspace_obj.isName() ? colorspace_obj.getName() : std::string());
    int components = 0;
    J_COLOR_SPACE cs = JCS_UNKNOWN;
    if (colorspace == "/DeviceRGB") {
        components = 3;
        cs = JCS_RGB;
    } else if (colorspace == "/DeviceGray") {
        components = 1;
        cs = JCS_GRAYSCALE;
    } else if (colorspace == "/DeviceCMYK") {
        components = 4;
        cs = JCS_CMYK;
    } else {
        QTC::TC("qpdf", "QPDFJob image optimize colorspace");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because qpdf can't optimize images with this colorspace\n";
            });
        }
        return result;
    }
    if (((this->oi_min_width > 0) && (w <= this->oi_min_width)) ||
        ((this->oi_min_height > 0) && (h <= this->oi_min_height)) ||
        ((this->oi_min_area > 0) && ((w * h) <= this->oi_min_area))) {
        QTC::TC("qpdf", "QPDFJob image optimize too small");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image is smaller than requested minimum "
                     "dimensions\n";
            });
        }
        return result;
    }

    result = std::make_shared<Pl_DCT>("jpg", next, w, h, components, cs, config.get());
    return result;
}